

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.c
# Opt level: O3

rxc_source * rxc_source_count(long from,long to)

{
  rxc_source *prVar1;
  
  prVar1 = (rxc_source *)malloc(0x20);
  if (prVar1 != (rxc_source *)0x0) {
    prVar1[1].dealloc = (_func_void_rxc_source_ptr_int *)from;
    prVar1[1].connect = (_func_void_rxc_source_ptr_rxc_sink_ptr *)to;
    prVar1->dealloc = dealloc;
    prVar1->connect = connect;
  }
  return prVar1;
}

Assistant:

struct rxc_source * rxc_source_count(long from, long to)
{
    struct rxc_source_count *source = malloc(sizeof(struct rxc_source_count));

    if (!source) {
        return NULL;
    }

    source->from = from;
    source->to = to;

    source->base.dealloc = dealloc;
    source->base.connect = connect;

    return &source->base;
}